

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

void __thiscall
Js::SegmentBTreeRoot::Add(SegmentBTreeRoot *this,Recycler *recycler,SparseArraySegmentBase *newSeg)

{
  SparseArraySegmentBase *pSVar1;
  BOOL BVar2;
  Recycler *pRVar3;
  SparseArraySegmentBase **ptr;
  uint *ptr_00;
  TrackAllocData local_c0;
  code *local_98;
  undefined8 local_90;
  TrackAllocData local_88;
  code *local_60;
  undefined8 local_58;
  TrackAllocData local_50;
  SegmentBTree *local_28;
  SegmentBTree *children;
  SparseArraySegmentBase *newSeg_local;
  Recycler *recycler_local;
  SegmentBTreeRoot *this_local;
  
  children = (SegmentBTree *)newSeg;
  newSeg_local = (SparseArraySegmentBase *)recycler;
  recycler_local = (Recycler *)this;
  BVar2 = SegmentBTree::IsFullNode(&this->super_SegmentBTree);
  pSVar1 = newSeg_local;
  if (BVar2 != 0) {
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_50,(type_info *)&SegmentBTree::typeinfo,0,0x28,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
               ,0xbf);
    pRVar3 = Memory::Recycler::TrackAllocInfo((Recycler *)pSVar1,&local_50);
    local_60 = Memory::Recycler::AllocZero;
    local_58 = 0;
    local_28 = Memory::AllocateArray<Memory::Recycler,Js::SegmentBTree,false>
                         ((Memory *)pRVar3,(Recycler *)Memory::Recycler::AllocZero,0,0x28);
    SegmentBTree::operator=(local_28,&this->super_SegmentBTree);
    pSVar1 = newSeg_local;
    (this->super_SegmentBTree).segmentCount = 0;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_88,(type_info *)&SparseArraySegmentBase*::typeinfo,0,0x27,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
               ,0xc5);
    pRVar3 = Memory::Recycler::TrackAllocInfo((Recycler *)pSVar1,&local_88);
    local_98 = Memory::Recycler::AllocLeafZero;
    local_90 = 0;
    ptr = Memory::AllocateArray<Memory::Recycler,Js::SparseArraySegmentBase*,false>
                    ((Memory *)pRVar3,(Recycler *)Memory::Recycler::AllocLeafZero,0,0x27);
    Memory::WriteBarrierPtr<Js::SparseArraySegmentBase_*>::operator=
              (&(this->super_SegmentBTree).segments,ptr);
    pSVar1 = newSeg_local;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_c0,(type_info *)&unsigned_int::typeinfo,0,0x27,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
               ,0xc6);
    pRVar3 = Memory::Recycler::TrackAllocInfo((Recycler *)pSVar1,&local_c0);
    ptr_00 = Memory::AllocateArray<Memory::Recycler,unsigned_int,false>
                       ((Memory *)pRVar3,(Recycler *)Memory::Recycler::AllocLeafZero,0,0x27);
    Memory::WriteBarrierPtr<unsigned_int>::operator=((WriteBarrierPtr<unsigned_int> *)this,ptr_00);
    Memory::WriteBarrierPtr<Js::SegmentBTree>::operator=
              (&(this->super_SegmentBTree).children,local_28);
    SegmentBTree::SplitChild((Recycler *)newSeg_local,&this->super_SegmentBTree,0,local_28);
  }
  SegmentBTree::InsertNonFullNode
            ((Recycler *)newSeg_local,&this->super_SegmentBTree,(SparseArraySegmentBase *)children);
  return;
}

Assistant:

void SegmentBTreeRoot::Add(Recycler* recycler, SparseArraySegmentBase* newSeg)
    {

        if (IsFullNode())
        {
            SegmentBTree * children = AllocatorNewArrayZ(Recycler, recycler, SegmentBTree, MaxDegree);
            children[0] = *this;

            // Even though the segments point to a GC pointer, the main array should keep a references
            // as well.  So just make it a leaf allocation
            this->segmentCount = 0;
            this->segments = AllocatorNewArrayLeafZ(Recycler, recycler, SparseArraySegmentBase*, MaxKeys);
            this->keys = AllocatorNewArrayLeafZ(Recycler,recycler,uint32,MaxKeys);
            this->children = children;

            // This split is the only way the tree gets deeper
            SplitChild(recycler, this, 0, &children[0]);
        }
        InsertNonFullNode(recycler, this, newSeg);
    }